

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scrolling_group.cpp
# Opt level: O0

bool h_scroll_active_proc(Am_Object *self)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  Am_Value *pAVar4;
  Am_Object local_40;
  Am_Object local_38;
  undefined4 local_30;
  Am_Object local_20;
  Am_Object group;
  Am_Object *self_local;
  
  group.data = (Am_Object_Data *)self;
  Am_Object::Get_Owner(&local_20,(Am_Slot_Flags)self);
  pAVar4 = Am_Object::Get(&local_20,0xcc,0);
  bVar1 = Am_Value::operator_cast_to_bool(pAVar4);
  if (bVar1) {
    pAVar4 = Am_Object::Get(&local_20,0x18e,0);
    iVar2 = Am_Value::operator_cast_to_int(pAVar4);
    pAVar4 = Am_Object::Get(&local_20,0x1c1,0);
    iVar3 = Am_Value::operator_cast_to_int(pAVar4);
    if (iVar3 <= iVar2) {
      self_local._7_1_ = true;
      goto LAB_0037101f;
    }
  }
  bVar1 = Am_Object::Valid(&local_20);
  if (bVar1) {
    Am_Object::Set(&local_20,0x11d,0,0);
    Am_Object::Get_Object(&local_40,(Am_Slot_Key)&local_20,0x1c3);
    Am_Object::Get_Object(&local_38,(Am_Slot_Key)&local_40,0xc5);
    Am_Object::Set(&local_38,0x169,0,0);
    Am_Object::~Am_Object(&local_38);
    Am_Object::~Am_Object(&local_40);
  }
  self_local._7_1_ = false;
LAB_0037101f:
  local_30 = 1;
  Am_Object::~Am_Object(&local_20);
  return self_local._7_1_;
}

Assistant:

Am_Define_Formula(bool, h_scroll_active)
{
  Am_Object group = self.Get_Owner();
  if ((bool)group.Get(Am_ACTIVE) &&
      ((int)group.Get(Am_INNER_WIDTH) >= (int)group.Get(Am_CLIP_WIDTH)))
    return true;
  else {
    if (group.Valid()) {
      group.Set(Am_X_OFFSET, 0); //make sure at origin when go inactive
      group.Get_Object(Am_H_SCROLLER, Am_NO_DEPENDENCY)
          .Get_Object(Am_COMMAND, Am_NO_DEPENDENCY)
          .Set(Am_VALUE, 0);
    }
    return false;
  }
}